

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::ConcurrentAtomicCounterCase::ConcurrentAtomicCounterCase
          (ConcurrentAtomicCounterCase *this,Context *context,char *name,char *description,
          int numCalls,int workSize)

{
  int workSize_local;
  int numCalls_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  ConcurrentAtomicCounterCase *this_local;
  
  gles31::TestCase::TestCase(&this->super_TestCase,context,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ConcurrentAtomicCounterCase_032b41e8;
  this->m_numCalls = numCalls;
  this->m_workSize = workSize;
  this->m_evenProgram = (ShaderProgram *)0x0;
  this->m_oddProgram = (ShaderProgram *)0x0;
  this->m_counterBuffer = 0;
  this->m_intermediateResultBuffer = 0;
  return;
}

Assistant:

ConcurrentAtomicCounterCase::ConcurrentAtomicCounterCase (Context& context, const char* name, const char* description, int numCalls, int workSize)
	: TestCase					(context, name, description)
	, m_numCalls				(numCalls)
	, m_workSize				(workSize)
	, m_evenProgram				(DE_NULL)
	, m_oddProgram				(DE_NULL)
	, m_counterBuffer			(DE_NULL)
	, m_intermediateResultBuffer(DE_NULL)
{
}